

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_dispatch.h
# Opt level: O0

unsigned_t __kmp_dispatch_guided_remaining<unsigned_int>(uint tc,floating_t base,unsigned_t idx)

{
  uint in_ESI;
  uint in_EDI;
  longdouble in_ST0;
  longdouble lVar1;
  double in_XMM0_Qa;
  UT r;
  longdouble x;
  undefined4 local_38;
  undefined4 local_4;
  
  __kmp_pow<unsigned_int>((longdouble *)(ulong)in_ESI,(longdouble)in_XMM0_Qa,in_ESI);
  in_ST0 = (longdouble)in_EDI * in_ST0;
  local_38 = (unsigned_t)(long)ROUND(in_ST0);
  lVar1 = (longdouble)((long)ROUND(in_ST0) & 0xffffffff);
  if ((in_ST0 != lVar1) || (NAN(in_ST0) || NAN(lVar1))) {
    local_4 = local_38 + 1;
  }
  else {
    local_4 = local_38;
  }
  return local_4;
}

Assistant:

static __inline typename traits_t<T>::unsigned_t
__kmp_dispatch_guided_remaining(T tc, typename traits_t<T>::floating_t base,
                                typename traits_t<T>::unsigned_t idx) {
  /* Note: On Windows* OS on IA-32 architecture and Intel(R) 64, at
     least for ICL 8.1, long double arithmetic may not really have
     long double precision, even with /Qlong_double.  Currently, we
     workaround that in the caller code, by manipulating the FPCW for
     Windows* OS on IA-32 architecture.  The lack of precision is not
     expected to be a correctness issue, though.
  */
  typedef typename traits_t<T>::unsigned_t UT;

  long double x = tc * __kmp_pow<UT>(base, idx);
  UT r = (UT)x;
  if (x == r)
    return r;
  return r + 1;
}